

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int array_grow(void **src,size_t num_items,size_t *allocation_len,size_t item_size)

{
  int iVar1;
  void *pvVar2;
  size_t new_n;
  
  iVar1 = 0;
  if (*allocation_len == num_items) {
    new_n = 2;
    if (num_items != 0) {
      new_n = num_items * 2;
    }
    pvVar2 = realloc_array(*src,num_items,new_n,item_size);
    if (pvVar2 == (void *)0x0) {
      iVar1 = -3;
    }
    else {
      clear_and_free(*src,item_size * num_items);
      *src = pvVar2;
      *allocation_len = new_n;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int array_grow(void **src, size_t num_items, size_t *allocation_len,
                      size_t item_size)
{
    if (num_items == *allocation_len) {
        /* Array is full, allocate more space */
        const size_t n = (*allocation_len == 0 ? 1 : *allocation_len) * 2;
        void *p = realloc_array(*src, *allocation_len, n, item_size);
        if (!p)
            return WALLY_ENOMEM;
        /* Free and replace the old array with the new enlarged copy */
        clear_and_free(*src, num_items * item_size);
        *src = p;
        *allocation_len = n;
    }
    return WALLY_OK;
}